

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcContext.cpp
# Opt level: O0

void __thiscall
deqp::Context::createRenderContext(Context *this,ContextType *contextType,ContextFlags ctxFlags)

{
  ApiType apiType;
  ContextFlags CVar1;
  RunMode RVar2;
  int iVar3;
  CommandLine *pCVar4;
  Platform *platform;
  RenderContext *pRVar5;
  ContextInfo *pCVar6;
  undefined4 extraout_var;
  ContextType local_58;
  undefined1 local_54 [8];
  RenderConfig renderCfg;
  ContextFlags ctxFlags_local;
  ContextType *contextType_local;
  Context *this_local;
  
  renderCfg.numSamples = ctxFlags;
  unique0x10000188 = contextType;
  apiType = glu::ContextType::getAPI(contextType);
  CVar1 = glu::ContextType::getFlags(stack0xffffffffffffffe8);
  CVar1 = glu::operator|(CVar1,renderCfg.numSamples);
  glu::ContextType::ContextType(&local_58,apiType,CVar1);
  glu::RenderConfig::RenderConfig((RenderConfig *)local_54,local_58);
  pCVar4 = tcu::TestContext::getCommandLine(this->m_testCtx);
  glu::parseRenderConfig((RenderConfig *)local_54,pCVar4);
  pCVar4 = tcu::TestContext::getCommandLine(this->m_testCtx);
  RVar2 = tcu::CommandLine::getRunMode(pCVar4);
  if (RVar2 != RUNMODE_EXECUTE) {
    renderCfg.width = 3;
  }
  platform = tcu::TestContext::getPlatform(this->m_testCtx);
  pCVar4 = tcu::TestContext::getCommandLine(this->m_testCtx);
  pRVar5 = glu::createRenderContext(platform,pCVar4,(RenderConfig *)local_54);
  this->m_renderCtx = pRVar5;
  pCVar6 = glu::ContextInfo::create(this->m_renderCtx);
  this->m_contextInfo = pCVar6;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  glw::setCurrentThreadFunctions((Functions *)CONCAT44(extraout_var,iVar3));
  return;
}

Assistant:

void Context::createRenderContext(glu::ContextType& contextType, glu::ContextFlags ctxFlags)
{
	DE_ASSERT(!m_renderCtx && !m_contextInfo);

	try
	{
		glu::RenderConfig renderCfg(glu::ContextType(contextType.getAPI(), contextType.getFlags() | ctxFlags));

		glu::parseRenderConfig(&renderCfg, m_testCtx.getCommandLine());

		if (m_testCtx.getCommandLine().getRunMode() != tcu::RUNMODE_EXECUTE)
		{
			// \todo [2016-11-16 pyry] Create DummyRenderContext instead to allow generating all case lists
			//						   on a system that doesn't support some GL(ES) versions.
			renderCfg.surfaceType = glu::RenderConfig::SURFACETYPE_OFFSCREEN_GENERIC;
		}

		m_renderCtx   = glu::createRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), renderCfg);
		m_contextInfo = glu::ContextInfo::create(*m_renderCtx);

		glw::setCurrentThreadFunctions(&m_renderCtx->getFunctions());
	}
	catch (...)
	{
		destroyRenderContext();
		throw;
	}
}